

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSetUp.h
# Opt level: O1

void __thiscall CppUnit::TestSetUp::~TestSetUp(TestSetUp *this)

{
  TestDecorator::~TestDecorator(&this->super_TestDecorator);
  operator_delete(this,0x10);
  return;
}

Assistant:

class CPPUNIT_API TestSetUp : public TestDecorator 
{
public:
  TestSetUp( Test *test );

  void run( TestResult *result );

protected:
  virtual void setUp();
  virtual void tearDown();

private:
  TestSetUp( const TestSetUp & );
  void operator =( const TestSetUp & );
}